

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O1

void xml_print_attrs(lyout *out,lyd_node *node,int options)

{
  lys_node *plVar1;
  char *__s;
  char *__s2;
  bool bVar2;
  int iVar3;
  lys_module *plVar4;
  char *text;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  char **ppcVar8;
  char **local_50;
  char **prefs;
  char **nss;
  uint local_34 [2];
  uint32_t ns_count;
  
  if (((node->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
     (((((options & 0xc0U) != 0 & node->field_0x9) != 0 ||
       (((options & 0x40U) != 0 && (node->field_0x9 & 1) == 0 &&
        (iVar3 = lyd_wd_default((lyd_node_leaf_list *)node), iVar3 != 0)))) &&
      (plVar4 = ly_ctx_get_module(node->schema->module->ctx,"ietf-netconf-with-defaults",(char *)0x0
                                 ), plVar4 != (lys_module *)0x0)))) {
    ly_print(out," %s:default=\"true\"",plVar4->prefix);
  }
  plVar1 = node->schema;
  nss = (char **)node;
  iVar3 = strcmp(plVar1->name,"filter");
  bVar2 = true;
  if (iVar3 == 0) {
    pcVar6 = plVar1->module->name;
    iVar3 = strcmp(pcVar6,"ietf-netconf");
    if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"notifications"), iVar3 == 0)) {
      bVar2 = false;
    }
  }
  pcVar6 = nss[2];
  if (pcVar6 != (char *)0x0) {
    text = (char *)0x0;
    ppcVar8 = nss;
    do {
      if (bVar2) {
        ly_print(out," %s:%s=\"",*(undefined8 *)(*(long *)(*(long *)(pcVar6 + 0x10) + 0x30) + 0x10),
                 *(undefined8 *)(pcVar6 + 0x18));
      }
      else {
        iVar3 = strcmp(*(char **)(pcVar6 + 0x18),"select");
        if (iVar3 == 0) {
          text = transform_json2xml(*(lys_module **)(*ppcVar8 + 0x30),*(char **)(pcVar6 + 0x20),
                                    &local_50,&prefs,local_34);
          if (text == (char *)0x0) {
            pcVar6 = "\"(!error!)\"";
            goto LAB_001820aa;
          }
          if (local_34[0] != 0) {
            uVar7 = 0;
            do {
              ly_print(out," xmlns:%s=\"%s\"",local_50[uVar7],prefs[uVar7]);
              uVar7 = uVar7 + 1;
            } while (uVar7 < local_34[0]);
          }
          free(local_50);
          free(prefs);
          ppcVar8 = nss;
        }
        ly_print(out," %s=\"",*(undefined8 *)(pcVar6 + 0x18));
      }
      switch(*(ushort *)(pcVar6 + 0x30) & 0x3f) {
      case 1:
      case 2:
      case 3:
      case 4:
      case 6:
      case 10:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
        if (*(char **)(pcVar6 + 0x20) != (char *)0x0) {
          pcVar5 = *(char **)(pcVar6 + 0x20);
          if (text != (char *)0x0) {
            pcVar5 = text;
          }
LAB_00181f39:
          lyxml_dump_text(out,pcVar5);
        }
        break;
      case 5:
        break;
      case 7:
        __s = *(char **)(pcVar6 + 0x20);
        ppcVar8 = nss;
        if (__s != (char *)0x0) {
          pcVar5 = strchr(__s,0x3a);
          if (pcVar5 == (char *)0x0) {
            __assert_fail("p",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                          ,0xd4,"void xml_print_attrs(struct lyout *, const struct lyd_node *, int)"
                         );
          }
          __s2 = *(char **)(*(long *)(*(long *)(pcVar6 + 0x10) + 0x30) + 8);
          iVar3 = strncmp(__s,__s2,(long)pcVar5 - (long)__s);
          ppcVar8 = nss;
          if ((iVar3 == 0) && (__s2[(long)pcVar5 - (long)__s] == '\0')) {
            pcVar5 = pcVar5 + 1;
            goto LAB_00181f39;
          }
          goto switchD_00181f26_caseD_8;
        }
        break;
      case 8:
switchD_00181f26_caseD_8:
        text = transform_json2xml(*(lys_module **)(*ppcVar8 + 0x30),ppcVar8[6],&local_50,&prefs,
                                  local_34);
        if (text == (char *)0x0) {
          pcVar6 = "(!error!)";
LAB_001820aa:
          ly_print(out,pcVar6);
          return;
        }
        if (local_34[0] != 0) {
          uVar7 = 0;
          do {
            ly_print(out," xmlns:%s=\"%s\"",local_50[uVar7],prefs[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar7 < local_34[0]);
        }
        free(local_50);
        free(prefs);
        lyxml_dump_text(out,text);
        ppcVar8 = nss;
        lydict_remove((ly_ctx *)**(undefined8 **)(*nss + 0x30),text);
        break;
      default:
        ly_print(out,"(!error!)");
      }
      ly_print(out,"\"");
      if (text != (char *)0x0) {
        lydict_remove((ly_ctx *)**(undefined8 **)(*ppcVar8 + 0x30),text);
      }
      pcVar6 = *(char **)(pcVar6 + 8);
    } while (pcVar6 != (char *)0x0);
  }
  return;
}

Assistant:

static void
xml_print_attrs(struct lyout *out, const struct lyd_node *node, int options)
{
    struct lyd_attr *attr;
    const char **prefs, **nss;
    const char *xml_expr = NULL, *mod_name;
    uint32_t ns_count, i;
    int rpc_filter = 0;
    const struct lys_module *wdmod = NULL;
    char *p;
    size_t len;

    /* with-defaults */
    if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        if ((node->dflt && (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG))) ||
                (!node->dflt && (options & LYP_WD_ALL_TAG) && lyd_wd_default((struct lyd_node_leaf_list *)node))) {
            /* we have implicit OR explicit default node */
            /* get with-defaults module */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL);
            if (wdmod) {
                /* print attribute only if context include with-defaults schema */
                ly_print(out, " %s:default=\"true\"", wdmod->prefix);
            }
        }
    }
    /* technically, check for the extension get-filter-element-attributes from ietf-netconf */
    if (!strcmp(node->schema->name, "filter")
            && (!strcmp(node->schema->module->name, "ietf-netconf") || !strcmp(node->schema->module->name, "notifications"))) {
        rpc_filter = 1;
    }

    for (attr = node->attr; attr; attr = attr->next) {
        if (rpc_filter) {
            /* exception for NETCONF's filter's attributes */
            if (!strcmp(attr->name, "select")) {
                /* xpath content, we have to convert the JSON format into XML first */
                xml_expr = transform_json2xml(node->schema->module, attr->value_str, &prefs, &nss, &ns_count);
                if (!xml_expr) {
                    /* error */
                    ly_print(out, "\"(!error!)\"");
                    return;
                }

                for (i = 0; i < ns_count; ++i) {
                    ly_print(out, " xmlns:%s=\"%s\"", prefs[i], nss[i]);
                }
                free(prefs);
                free(nss);
            }
            ly_print(out, " %s=\"", attr->name);
        } else {
            ly_print(out, " %s:%s=\"", attr->annotation->module->prefix, attr->name);
        }

        switch (attr->value_type & LY_DATA_TYPE_MASK) {
        case LY_TYPE_BINARY:
        case LY_TYPE_STRING:
        case LY_TYPE_BITS:
        case LY_TYPE_ENUM:
        case LY_TYPE_BOOL:
        case LY_TYPE_DEC64:
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (attr->value_str) {
                /* xml_expr can contain transformed xpath */
                lyxml_dump_text(out, xml_expr ? xml_expr : attr->value_str);
            }
            break;

        case LY_TYPE_IDENT:
            if (!attr->value_str) {
                break;
            }
            p = strchr(attr->value_str, ':');
            assert(p);
            len = p - attr->value_str;
            mod_name = attr->annotation->module->name;
            if (!strncmp(attr->value_str, mod_name, len) && !mod_name[len]) {
                lyxml_dump_text(out, ++p);
            } else {
                /* avoid code duplication - use instance-identifier printer which gets necessary namespaces to print */
                goto printinst;
            }
            break;
        case LY_TYPE_INST:
printinst:
            xml_expr = transform_json2xml(node->schema->module, ((struct lyd_node_leaf_list *)node)->value_str,
                                          &prefs, &nss, &ns_count);
            if (!xml_expr) {
                /* error */
                ly_print(out, "(!error!)");
                return;
            }

            for (i = 0; i < ns_count; ++i) {
                ly_print(out, " xmlns:%s=\"%s\"", prefs[i], nss[i]);
            }
            free(prefs);
            free(nss);

            lyxml_dump_text(out, xml_expr);
            lydict_remove(node->schema->module->ctx, xml_expr);
            break;

        /* LY_TYPE_LEAFREF not allowed */
        case LY_TYPE_EMPTY:
            break;

        default:
            /* error */
            ly_print(out, "(!error!)");
        }

        ly_print(out, "\"");

        if (xml_expr) {
            lydict_remove(node->schema->module->ctx, xml_expr);
        }
    }
}